

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O1

Face * __thiscall OpenMesh::ArrayKernel::face(ArrayKernel *this,FaceHandle _fh)

{
  int iVar1;
  
  if (-1 < (int)_fh.super_BaseHandle.idx_) {
    iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[5])();
    if ((int)_fh.super_BaseHandle.idx_ < iVar1) {
      return (this->faces_).
             super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
             ._M_impl.super__Vector_impl_data._M_start + (uint)_fh.super_BaseHandle.idx_;
    }
  }
  __assert_fail("is_valid_handle(_fh)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Mesh/ArrayKernel.hh"
                ,0xb6,"Face &OpenMesh::ArrayKernel::face(FaceHandle)");
}

Assistant:

Face& face(FaceHandle _fh)
  {
    assert(is_valid_handle(_fh));
    return faces_[_fh.idx()];
  }